

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall amrex::MLEBTensorOp::prepareForSolve(MLEBTensorOp *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Long LVar4;
  MLLinOp *in_RDI;
  int icomp;
  int idim_1;
  int amrlev_4;
  int mglev_3;
  int amrlev_3;
  int mglev_2;
  int amrlev_2;
  int idim;
  int mglev_1;
  int amrlev_1;
  char *in_stack_000000c8;
  int in_stack_000000d4;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  int mglev;
  int amrlev;
  int in_stack_000003dc;
  IntVect *in_stack_000003e0;
  MultiFab *in_stack_000003e8;
  MultiFab *in_stack_000003f0;
  Geometry *in_stack_00000478;
  IntVect *in_stack_00000480;
  Array<MultiFab_*,_3> *in_stack_00000488;
  Array<const_MultiFab_*,_3> *in_stack_00000490;
  int in_stack_000007e4;
  IntVect *in_stack_000007e8;
  Array<MultiFab_*,_3> *in_stack_000007f0;
  Array<const_MultiFab_*,_3> *in_stack_000007f8;
  reference in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  reference in_stack_fffffffffffffed0;
  MultiFab *in_stack_fffffffffffffed8;
  MultiFab *in_stack_fffffffffffffee0;
  Real in_stack_fffffffffffffee8;
  MultiFab *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  IntVect local_d8;
  IntVect local_cc;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  IntVect local_ac [5];
  IntVect local_6c [5];
  int local_30;
  int local_2c;
  char *local_20;
  undefined4 local_14;
  char *local_10;
  char *local_8;
  
  if ((*(byte *)((long)&in_RDI[2].info.hidden_direction + 1) & 1) !=
      (*(byte *)((long)&in_RDI[2].info.hidden_direction + 2) & 1)) {
    local_8 = "m_has_kappa == m_has_eb_kappa";
    local_10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBTensorOp.cpp"
    ;
    local_14 = 0x8f;
    local_20 = "\"MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.\"";
    Assert_host(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000c8);
  }
  if ((in_RDI[2].info.hidden_direction & 0x100) == 0) {
    for (local_b0 = 0; iVar1 = local_b0, iVar2 = MLLinOp::NAMRLevels(in_RDI), iVar1 < iVar2;
        local_b0 = local_b0 + 1) {
      local_b4 = 0;
      while( true ) {
        in_stack_fffffffffffffef0 = (MultiFab *)(long)local_b4;
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        LVar4 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                ::size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)0x181ec66);
        if (LVar4 <= (long)in_stack_fffffffffffffef0) break;
        for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
          Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
          ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (size_type)in_stack_fffffffffffffea8);
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (size_type)in_stack_fffffffffffffea8);
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (value_type)in_stack_fffffffffffffea8);
        }
        local_b4 = local_b4 + 1;
      }
    }
  }
  else {
    local_2c = MLLinOp::NAMRLevels(in_RDI);
    while (local_2c = local_2c + -1, -1 < local_2c) {
      local_30 = 1;
      while( true ) {
        lVar3 = (long)local_30;
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        LVar4 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                ::size((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)0x181ea42);
        if (LVar4 <= lVar3) break;
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        GetArrOfConstPtrs<amrex::MultiFab>
                  ((array<amrex::MultiFab,_3UL> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
                  ((array<amrex::MultiFab,_3UL> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        IntVect::IntVect(local_6c,2);
        EB_average_down_faces
                  (in_stack_000007f8,in_stack_000007f0,in_stack_000007e8,in_stack_000007e4);
        local_30 = local_30 + 1;
      }
      if (0 < local_2c) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        std::
        vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::back((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        GetArrOfConstPtrs<amrex::MultiFab>
                  ((array<amrex::MultiFab,_3UL> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        std::
        vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::front((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
                  ((array<amrex::MultiFab,_3UL> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        IntVect::IntVect(local_ac,2);
        Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (size_type)in_stack_fffffffffffffea8);
        EB_average_down_faces
                  (in_stack_00000490,in_stack_00000488,in_stack_00000480,in_stack_00000478);
      }
    }
  }
  if ((in_RDI[2].info.hidden_direction & 0x10000) == 0) {
    for (local_dc = 0; iVar1 = MLLinOp::NAMRLevels(in_RDI), local_dc < iVar1;
        local_dc = local_dc + 1) {
      local_e0 = 0;
      while( true ) {
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        LVar4 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                          ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x181ef30);
        if (LVar4 <= local_e0) break;
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (size_type)in_stack_fffffffffffffea8);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (value_type)in_stack_fffffffffffffea8);
        local_e0 = local_e0 + 1;
      }
    }
  }
  else {
    local_bc = MLLinOp::NAMRLevels(in_RDI);
    while (local_bc = local_bc + -1, -1 < local_bc) {
      local_c0 = 1;
      while( true ) {
        in_stack_fffffffffffffee8 = (Real)(long)local_c0;
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        LVar4 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                          ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x181ed82);
        if (LVar4 <= (long)in_stack_fffffffffffffee8) break;
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        in_stack_fffffffffffffed8 =
             Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (size_type)in_stack_fffffffffffffea8);
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        in_stack_fffffffffffffee0 =
             Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (size_type)in_stack_fffffffffffffea8);
        IntVect::IntVect(&local_cc,2);
        EB_average_down_boundaries
                  (in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003dc);
        local_c0 = local_c0 + 1;
      }
      if (0 < local_bc) {
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                  ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (size_type)in_stack_fffffffffffffea8);
        in_stack_fffffffffffffed0 =
             std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::front
                       ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        IntVect::IntVect(&local_d8,2);
        EB_average_down_boundaries
                  (in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003dc);
      }
    }
  }
  local_e4 = 0;
  while (iVar1 = local_e4, iVar2 = MLLinOp::NAMRLevels(in_RDI), iVar1 < iVar2) {
    for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
      in_stack_ffffffffffffff14 = local_e8;
      Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),(size_type)in_stack_fffffffffffffea8
                  );
      Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
      operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),(size_type)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffea8 =
           std::array<amrex::MultiFab,_3UL>::operator[]
                     ((array<amrex::MultiFab,_3UL> *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                      (size_type)in_stack_fffffffffffffea8);
      Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),(size_type)in_stack_fffffffffffffea8
                  );
      Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
      operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),(size_type)in_stack_fffffffffffffea8);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                 (size_type)in_stack_fffffffffffffea8);
      MultiFab::Xpay(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0)
      ;
    }
    local_e4 = local_e4 + 1;
  }
  MLEBABecLap::prepareForSolve
            ((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void
MLEBTensorOp::prepareForSolve ()
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_has_kappa == m_has_eb_kappa,
        "MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.");

    if (m_has_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev][mglev-1]),
                                             GetArrOfPtrs     (m_kappa[amrlev][mglev  ]),
                                             IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev  ].back()),
                                             GetArrOfPtrs     (m_kappa[amrlev-1].front()),
                                             IntVect(mg_coarsen_ratio), m_geom[amrlev-1][0]);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_kappa[amrlev].size(); ++mglev) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    m_kappa[amrlev][mglev][idim].setVal(0.0);
                }
            }
        }
    }

    if (m_has_eb_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev][mglev-1],
                                                  m_eb_kappa[amrlev][mglev  ],
                                                  IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev  ].back(),
                                                  m_eb_kappa[amrlev-1].front(),
                                                  IntVect(mg_coarsen_ratio), 0);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                m_eb_kappa[amrlev][mglev].setVal(0.0);
            }
        }
    }

    for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int icomp = idim;
            MultiFab::Xpay(m_b_coeffs[amrlev][0][idim], 4./3.,
                           m_kappa[amrlev][0][idim], 0, icomp, 1, 0);
        }
    }

    MLEBABecLap::prepareForSolve();
}